

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

first_of_any_result __thiscall
c4::basic_substring<char_const>::first_of_any_iter<c4::basic_substring<char_const>*>
          (basic_substring<char_const> *this,basic_substring<const_char> *first_span,
          basic_substring<const_char> *last_span)

{
  code *pcVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  basic_substring<const_char> *pbVar7;
  bool bVar8;
  char cVar9;
  first_of_any_result fVar10;
  ulong local_48;
  size_t local_40;
  
  if (*(long *)(this + 8) == 0) {
    local_40 = 0xffffffffffffffff;
    local_48 = 0xffffffffffffffff;
  }
  else {
    uVar5 = 0;
    do {
      cVar9 = '\x05';
      if (first_span != last_span) {
        sVar4 = 0;
        pbVar7 = first_span;
        do {
          cVar9 = '\a';
          uVar2 = local_48;
          sVar3 = local_40;
          if ((pbVar7->len + uVar5 <= *(ulong *)(this + 8)) &&
             (cVar9 = pbVar7->len == 0, uVar2 = uVar5, sVar3 = sVar4, !(bool)cVar9)) {
            uVar6 = 0;
            do {
              if (*(ulong *)(this + 8) <= uVar6 + uVar5) {
                first_of_any_iter<c4::basic_substring<char_const>*>();
              }
              if (pbVar7->len <= uVar6) {
                if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                  pcVar1 = (code *)swi(3);
                  fVar10 = (first_of_any_result)(*pcVar1)();
                  return fVar10;
                }
                handle_error(0x1fbf87,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x14c4,"i >= 0 && i < len");
              }
              uVar2 = local_48;
              sVar3 = local_40;
              if (*(char *)(uVar6 + *(long *)this + uVar5) != pbVar7->str[uVar6]) break;
              uVar6 = uVar6 + 1;
              bVar8 = uVar6 < pbVar7->len;
              cVar9 = !bVar8;
              uVar2 = uVar5;
              sVar3 = sVar4;
            } while (bVar8);
          }
          local_40 = sVar3;
          local_48 = uVar2;
          if ((cVar9 != '\a') && (cVar9 != '\0')) goto LAB_001f3523;
          sVar4 = sVar4 + 1;
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != last_span);
        cVar9 = '\x05';
      }
LAB_001f3523:
      if ((cVar9 != '\x05') && (cVar9 != '\0')) goto LAB_001f355d;
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(ulong *)(this + 8));
    local_40 = 0xffffffffffffffff;
    local_48 = 0xffffffffffffffff;
  }
LAB_001f355d:
  fVar10.pos = local_48;
  fVar10.which = local_40;
  return fVar10;
}

Assistant:

first_of_any_result first_of_any_iter(It first_span, It last_span) const
    {
        for(size_t i = 0; i < len; ++i)
        {
            size_t curr = 0;
            for(It it = first_span; it != last_span; ++curr, ++it)
            {
                auto const& chars = *it;
                if((i + chars.len) > len) continue;
                bool gotit = true;
                for(size_t j = 0; j < chars.len; ++j)
                {
                    C4_ASSERT(i + j < len);
                    if(str[i + j] != chars[j])
                    {
                        gotit = false;
                        break;
                    }
                }
                if(gotit)
                {
                    return {curr, i};
                }
            }
        }
        return {NONE, npos};
    }